

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Heap<int>::Heap(Heap<int> *this,initializer_list<int> list,function<bool_(int_&,_int_&)> *func)

{
  initializer_list<int> __l;
  size_type sVar1;
  uint local_54;
  uint local_50;
  int index;
  int i;
  allocator<int> local_39;
  Heap<int> *local_38;
  iterator piStack_30;
  function<bool_(int_&,_int_&)> *local_28;
  function<bool_(int_&,_int_&)> *func_local;
  Heap<int> *this_local;
  initializer_list<int> list_local;
  
  list_local._M_array = (iterator)list._M_len;
  this_local = (Heap<int> *)list._M_array;
  local_28 = func;
  func_local = (function<bool_(int_&,_int_&)> *)this;
  sVar1 = std::initializer_list<int>::size((initializer_list<int> *)&this_local);
  this->_size = (uint)sVar1;
  local_38 = this_local;
  piStack_30 = list_local._M_array;
  std::allocator<int>::allocator(&local_39);
  __l._M_len = (size_type)piStack_30;
  __l._M_array = (iterator)local_38;
  std::vector<int,_std::allocator<int>_>::vector(&this->_data,__l,&local_39);
  std::allocator<int>::~allocator(&local_39);
  std::function<bool_(int_&,_int_&)>::function(&this->fun,func);
  for (local_50 = 0; local_50 < this->_size; local_50 = local_50 + 1) {
    HeapifyDown(this,local_50);
  }
  for (local_54 = 0; local_54 < this->_size; local_54 = local_54 + 1) {
    HeapifyUp(this,local_54);
  }
  return;
}

Assistant:

Heap<T>::Heap(initializer_list<T> list, function<bool(T &, T &)> func):_size(list.size()),_data(list),fun(func) {
    for(int i=0;i<_size;++i) {
        HeapifyDown(i);

    }
    for(int index=0;index<_size;++index) {
        HeapifyUp(index);
    }

}